

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.h
# Opt level: O2

void __thiscall MeCab::FeatureIndex::FeatureIndex(FeatureIndex *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_FeatureIndex = (_func_int **)&PTR___cxa_pure_virtual_0019f0f0;
  (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->feature_freelist_)._vptr_ChunkFreeList = (_func_int **)&PTR__ChunkFreeList_0019f148;
  (this->feature_freelist_).li_ = 0;
  (this->feature_freelist_).freelist_.
  super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->feature_freelist_).freelist_.
  super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->feature_freelist_).freelist_.
  super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->feature_freelist_).pi_ = 0;
  (this->feature_freelist_).default_size = 0x40000;
  (this->char_freelist_)._vptr_ChunkFreeList = (_func_int **)&PTR__ChunkFreeList_0019eba8;
  (this->char_freelist_).freelist_.
  super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->char_freelist_).freelist_.
  super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->char_freelist_).freelist_.
  super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->char_freelist_).pi_ = 0;
  (this->char_freelist_).li_ = 0;
  (this->char_freelist_).default_size = 0x40000;
  (this->rewrite_).cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rewrite_).cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->rewrite_).cache_._M_t._M_impl.super__Rb_tree_header;
  (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rewrite_).unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewrite_).unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewrite_).unigram_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rewrite_).left_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewrite_).left_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewrite_).left_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rewrite_).right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewrite_).right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewrite_).right_rewrite_.
  super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rewrite_).cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rewrite_).cache_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->rewrite_).cache_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->os_)._vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_0019f328;
  (this->os_).ptr_ = (char *)0x0;
  (this->os_).size_ = 0;
  (this->os_).alloc_size_ = 0;
  (this->os_).is_delete_ = true;
  (this->os_).error_ = false;
  this->maxid_ = 0;
  this->alpha_ = (double *)0x0;
  return;
}

Assistant:

explicit FeatureIndex(): feature_freelist_(8192 * 32),
                           char_freelist_(8192 * 32),
                           maxid_(0), alpha_(0) {}